

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

deUint32 __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::calcDrawBufferSize
          (ComputeShaderGeneratedCase *this)

{
  int iVar1;
  deUint32 dVar2;
  
  if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    iVar1 = this->m_gridSize + 1;
    dVar2 = iVar1 * iVar1 * 4;
  }
  else {
    dVar2 = 0;
    if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
      return this->m_gridSize * this->m_gridSize * 0xc;
    }
  }
  return dVar2;
}

Assistant:

deUint32 ComputeShaderGeneratedCase::calcDrawBufferSize (void) const
{
	// returns size in "vec4"s
	if (m_drawMethod == DRAWMETHOD_DRAWARRAYS)
		return m_gridSize*m_gridSize*6*2;
	else if (m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
		return (m_gridSize+1)*(m_gridSize+1)*4;
	else
		DE_ASSERT(DE_FALSE);

	return 0;
}